

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

RegexMatcher * __thiscall icu_63::RegexMatcher::reset(RegexMatcher *this)

{
  int64_t iVar1;
  
  this->fRegionStart = 0;
  iVar1 = this->fInputLength;
  this->fRegionLimit = iVar1;
  this->fActiveStart = 0;
  this->fActiveLimit = iVar1;
  this->fAnchorStart = 0;
  this->fAnchorLimit = iVar1;
  this->fLookStart = 0;
  this->fLookLimit = iVar1;
  resetPreserveRegion(this);
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::reset() {
    fRegionStart    = 0;
    fRegionLimit    = fInputLength;
    fActiveStart    = 0;
    fActiveLimit    = fInputLength;
    fAnchorStart    = 0;
    fAnchorLimit    = fInputLength;
    fLookStart      = 0;
    fLookLimit      = fInputLength;
    resetPreserveRegion();
    return *this;
}